

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetRepaintManager::~QWidgetRepaintManager(QWidgetRepaintManager *this)

{
  QWidgetRepaintManager *this_00;
  ulong uVar1;
  
  this_00 = this;
  for (uVar1 = 0; uVar1 < *(ulong *)(this + 0x28); uVar1 = uVar1 + 1) {
    resetWidget(this_00,*(QWidget **)(*(long *)(this + 0x20) + uVar1 * 8));
  }
  for (uVar1 = 0; uVar1 < *(ulong *)(this + 0x40); uVar1 = uVar1 + 1) {
    resetWidget(this_00,*(QWidget **)(*(long *)(this + 0x38) + uVar1 * 8));
  }
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)(this + 0x68));
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)(this + 0x50));
  QRegion::~QRegion((QRegion *)(this + 0x48));
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)(this + 0x30));
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)(this + 0x18));
  QRegion::~QRegion((QRegion *)(this + 0x10));
  return;
}

Assistant:

QWidgetRepaintManager::~QWidgetRepaintManager()
{
    for (int c = 0; c < dirtyWidgets.size(); ++c)
        resetWidget(dirtyWidgets.at(c));
    for (int c = 0; c < dirtyRenderToTextureWidgets.size(); ++c)
        resetWidget(dirtyRenderToTextureWidgets.at(c));
}